

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O2

void qp_free(priority_queue *qp,_func_void_void_ptr *payload_free)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  if (qp == (priority_queue *)0x0) {
    return;
  }
  uVar1 = qp->count;
  if (uVar1 <= qp->size) {
    if (payload_free != (_func_void_void_ptr *)0x0) {
      lVar3 = 0;
      for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
        (*payload_free)(*(void **)((long)&qp->data->payload + lVar3));
        uVar1 = qp->count;
        lVar3 = lVar3 + 0x10;
      }
    }
    mem_free(qp->data);
    mem_free(qp);
    return;
  }
  __assert_fail("qp->count <= qp->size",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-queue.c",
                0x114,"void qp_free(struct priority_queue *, void (*)(void *))");
}

Assistant:

void qp_free(struct priority_queue *qp, void (*payload_free)(void*))
{
	if (!qp) {
		return;
	}
	assert(qp->count <= qp->size);
	if (payload_free) {
		size_t i;

		for (i = 0; i < qp->count; ++i) {
			(*payload_free)(qp->data[i].payload.p);
		}
	}
	mem_free(qp->data);
	mem_free(qp);
}